

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O3

void calc<double>(string *Ja_in,string *Jb_in,string *Jc_in)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  double dVar10;
  undefined4 uVar11;
  char *local_58;
  string *local_50;
  double local_48;
  double local_40;
  double local_38;
  char **__nptr;
  
  __nptr = (char **)(Ja_in->_M_dataplus)._M_p;
  local_50 = Jc_in;
  piVar3 = __errno_location();
  iVar8 = *piVar3;
  *piVar3 = 0;
  local_40 = strtod((char *)__nptr,&local_58);
  if ((char **)CONCAT71(local_58._1_7_,local_58._0_1_) == __nptr) {
    std::__throw_invalid_argument("stod");
  }
  else {
    iVar7 = *piVar3;
    if (iVar7 == 0) {
LAB_0010719e:
      *piVar3 = iVar8;
      iVar7 = iVar8;
    }
    else if (iVar7 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0010719e;
    }
    pcVar1 = (Jb_in->_M_dataplus)._M_p;
    *piVar3 = 0;
    dVar10 = strtod(pcVar1,&local_58);
    __nptr = &local_58;
    if ((char *)CONCAT71(local_58._1_7_,local_58._0_1_) != pcVar1) {
      iVar8 = *piVar3;
      local_48 = dVar10;
      if (iVar8 == 0) {
LAB_001071e5:
        *piVar3 = iVar7;
        iVar8 = iVar7;
      }
      else if (iVar8 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_001071e5;
      }
      pcVar1 = (local_50->_M_dataplus)._M_p;
      *piVar3 = 0;
      dVar10 = strtod(pcVar1,&local_58);
      if ((char *)CONCAT71(local_58._1_7_,local_58._0_1_) != pcVar1) {
        uVar9 = SUB84(dVar10,0);
        uVar11 = (undefined4)((ulong)dVar10 >> 0x20);
        if (*piVar3 != 0) {
          if (*piVar3 != 0x22) goto LAB_0010722c;
          std::__throw_out_of_range("stod");
        }
        *piVar3 = iVar8;
LAB_0010722c:
        local_38 = (double)CONCAT44(uVar11,uVar9);
        local_50 = (string *)
                   ising::tc::triangular<double>(local_40,local_48,(double)CONCAT44(uVar11,uVar9));
        lVar2 = std::cout;
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             0x100;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0xf;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# precision: ",0xd);
        plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,0xf);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Ja Jb Jc Tc 1/Tc",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = std::ostream::_M_insert<double>(local_40);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(local_48);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(local_38);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>((double)local_50);
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        poVar5 = std::ostream::_M_insert<double>(1.0 / (double)local_50);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        return;
      }
      goto LAB_0010740b;
    }
  }
  iVar8 = (int)__nptr;
  std::__throw_invalid_argument("stod");
LAB_0010740b:
  uVar6 = std::__throw_invalid_argument("stod");
  if (*piVar3 == 0) {
    *piVar3 = iVar8;
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}